

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_utf8.c
# Opt level: O1

int cm_utf8_is_valid(char *s)

{
  size_t sVar1;
  char *last;
  uint pc;
  uint local_1c;
  
  if (s == (char *)0x0) {
    return 0;
  }
  sVar1 = strlen(s);
  last = s + sVar1;
  do {
    if (s == last) goto LAB_0042a1cc;
    s = cm_utf8_decode_character(s,last,&local_1c);
  } while (s != (char *)0x0);
  s = (char *)0x0;
LAB_0042a1cc:
  return (int)(s == last);
}

Assistant:

int cm_utf8_is_valid(const char* s)
{
  if (!s) {
    return 0;
  }

  const char* last = s + strlen(s);
  const char* pos = s;
  unsigned int pc;

  while (pos != last && (pos = cm_utf8_decode_character(pos, last, &pc))) {
    /* Nothing to do. */
  }

  return pos == last;
}